

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

uint32_t helper_sve_pnext_aarch64(void *vd,void *vg,uint32_t pred_desc)

{
  ulong uVar1;
  uint32_t uVar2;
  int iVar3;
  ulong words_00;
  intptr_t iVar4;
  ulong val;
  uint64_t local_78;
  uint64_t this_d;
  uint64_t this_g;
  uint64_t mask;
  intptr_t next;
  intptr_t i;
  uint64_t esz_mask;
  uint64_t *g;
  uint64_t *d;
  uint32_t flags;
  intptr_t esz;
  intptr_t words;
  uint32_t pred_desc_local;
  void *vg_local;
  void *vd_local;
  
  uVar2 = extract32(pred_desc,0,5);
  words_00 = (ulong)uVar2;
  uVar2 = extract32(pred_desc,10,2);
  d._4_4_ = 1;
  iVar4 = last_active_element((uint64_t *)vd,words_00,(ulong)uVar2);
  mask = iVar4 + (1L << ((byte)uVar2 & 0x3f));
  uVar1 = pred_esz_masks_aarch64[uVar2];
  if ((long)mask < (long)(words_00 * 0x40)) {
    this_g = 0xffffffffffffffff;
    if ((mask & 0x3f) != 0) {
      this_g = (1L << ((byte)mask & 0x3f)) - 1U ^ 0xffffffffffffffff;
      mask = mask & 0xffffffffffffffc0;
    }
    do {
      val = *(ulong *)((long)vg + ((long)mask / 0x40) * 8) & uVar1 & this_g;
      if (val != 0) {
        iVar3 = ctz64(val);
        mask = (mask & 0xffffffffffffffc0) + (long)iVar3;
        break;
      }
      mask = mask + 0x40;
      this_g = 0xffffffffffffffff;
    } while ((long)mask < (long)(words_00 * 0x40));
  }
  next = 0;
  do {
    local_78 = 0;
    if (next == (long)mask / 0x40) {
      local_78 = 1L << ((byte)mask & 0x3f);
    }
    *(uint64_t *)((long)vd + next * 8) = local_78;
    d._4_4_ = iter_predtest_fwd(local_78,*(ulong *)((long)vg + next * 8) & uVar1,d._4_4_);
    next = next + 1;
  } while (next < (long)words_00);
  return d._4_4_;
}

Assistant:

uint32_t HELPER(sve_pnext)(void *vd, void *vg, uint32_t pred_desc)
{
    intptr_t words = extract32(pred_desc, 0, SIMD_OPRSZ_BITS);
    intptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    uint32_t flags = PREDTEST_INIT;
    uint64_t *d = vd, *g = vg, esz_mask;
    intptr_t i, next;

    next = last_active_element(vd, words, esz) + (1ULL << esz);
    esz_mask = pred_esz_masks[esz];

    /* Similar to the pseudocode for pnext, but scaled by ESZ
       so that we find the correct bit.  */
    if (next < words * 64) {
        uint64_t mask = -1;

        if (next & 63) {
            mask = ~((1ull << (next & 63)) - 1);
            next &= -64;
        }
        do {
            uint64_t this_g = g[next / 64] & esz_mask & mask;
            if (this_g != 0) {
                next = (next & -64) + ctz64(this_g);
                break;
            }
            next += 64;
            mask = -1;
        } while (next < words * 64);
    }

    i = 0;
    do {
        uint64_t this_d = 0;
        if (i == next / 64) {
            this_d = 1ull << (next & 63);
        }
        d[i] = this_d;
        flags = iter_predtest_fwd(this_d, g[i] & esz_mask, flags);
    } while (++i < words);

    return flags;
}